

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLQuaternion.cpp
# Opt level: O0

Quaternion * AML::dcm2Quat(Quaternion *__return_storage_ptr__,Matrix33 *dcm)

{
  bool bVar1;
  double dVar2;
  double __x;
  double __x_00;
  double __x_01;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double x2q3;
  double x2q2;
  double x2q1;
  double x2q0;
  double x4q0q3;
  double x4q0q2;
  double x4q0q1;
  double x4q1q2;
  double x4q1q3;
  double x4q2q3;
  double x4q3_2;
  double x4q2_2;
  double x4q1_2;
  double x4q0_2;
  double q3;
  double q2;
  double q1;
  double q0;
  double TOL;
  Matrix33 *dcm_local;
  
  bVar1 = isValidDCM(dcm,0.0001);
  if (bVar1) {
    q1 = 0.0;
    q2 = 0.0;
    q3 = 0.0;
    x4q0_2 = 0.0;
    dVar2 = (dcm->field_0).data[0][0] + 1.0 + (dcm->field_0).data[1][1] + (dcm->field_0).data[2][2];
    __x = (((dcm->field_0).data[0][0] + 1.0) - (dcm->field_0).data[1][1]) -
          (dcm->field_0).data[2][2];
    __x_00 = ((1.0 - (dcm->field_0).data[0][0]) + (dcm->field_0).data[1][1]) -
             (dcm->field_0).data[2][2];
    __x_01 = ((1.0 - (dcm->field_0).data[0][0]) - (dcm->field_0).data[1][1]) +
             (dcm->field_0).data[2][2];
    dVar3 = (dcm->field_0).data[1][2] + (dcm->field_0).data[2][1];
    dVar4 = (dcm->field_0).data[2][0] + (dcm->field_0).data[0][2];
    dVar5 = (dcm->field_0).data[0][1] + (dcm->field_0).data[1][0];
    dVar6 = (dcm->field_0).data[1][2] - (dcm->field_0).data[2][1];
    dVar7 = (dcm->field_0).data[2][0] - (dcm->field_0).data[0][2];
    dVar8 = (dcm->field_0).data[0][1] - (dcm->field_0).data[1][0];
    if (((dVar2 < __x) || (dVar2 < __x_00)) || (dVar2 < __x_01)) {
      if (((__x < dVar2) || (__x < __x_00)) || (__x < __x_01)) {
        if (((__x_00 < dVar2) || (__x_00 < __x)) || (__x_00 < __x_01)) {
          if (((dVar2 <= __x_01) && (__x <= __x_01)) && (__x_00 <= __x_01)) {
            dVar2 = sqrt(__x_01);
            q1 = (dVar8 * 0.5) / dVar2;
            q2 = (dVar4 * 0.5) / dVar2;
            q3 = (dVar3 * 0.5) / dVar2;
            x4q0_2 = dVar2 * 0.5;
          }
        }
        else {
          dVar2 = sqrt(__x_00);
          q1 = (dVar7 * 0.5) / dVar2;
          q2 = (dVar5 * 0.5) / dVar2;
          q3 = dVar2 * 0.5;
          x4q0_2 = (dVar3 * 0.5) / dVar2;
        }
      }
      else {
        dVar2 = sqrt(__x);
        q1 = (dVar6 * 0.5) / dVar2;
        q2 = dVar2 * 0.5;
        q3 = (dVar5 * 0.5) / dVar2;
        x4q0_2 = (dVar4 * 0.5) / dVar2;
      }
    }
    else {
      dVar2 = sqrt(dVar2);
      q1 = dVar2 * 0.5;
      q2 = (dVar6 * 0.5) / dVar2;
      q3 = (dVar7 * 0.5) / dVar2;
      x4q0_2 = (dVar8 * 0.5) / dVar2;
    }
    Quaternion::Quaternion(__return_storage_ptr__,q1,q2,q3,x4q0_2);
  }
  else {
    Quaternion::identity();
  }
  return __return_storage_ptr__;
}

Assistant:

Quaternion dcm2Quat(const Matrix33& dcm)
    {
        const double TOL = 0.0001;

        // Check if DCM is Valid
        if (isValidDCM(dcm, TOL))
        {
            double q0 = 0.0;
            double q1 = 0.0;
            double q2 = 0.0;
            double q3 = 0.0;
            const double x4q0_2 = (1.0 + dcm.m11 + dcm.m22 + dcm.m33);
            const double x4q1_2 = (1.0 + dcm.m11 - dcm.m22 - dcm.m33);
            const double x4q2_2 = (1.0 - dcm.m11 + dcm.m22 - dcm.m33);
            const double x4q3_2 = (1.0 - dcm.m11 - dcm.m22 + dcm.m33);
            const double x4q2q3 = dcm.m23 + dcm.m32;
            const double x4q1q3 = dcm.m31 + dcm.m13;
            const double x4q1q2 = dcm.m12 + dcm.m21;
            const double x4q0q1 = dcm.m23 - dcm.m32;
            const double x4q0q2 = dcm.m31 - dcm.m13;
            const double x4q0q3 = dcm.m12 - dcm.m21;

            // Check which Trace is Largest
            if (x4q0_2 >= x4q1_2 && x4q0_2 >= x4q2_2 && x4q0_2 >= x4q3_2) // 4q0_2 Largest
            {
                const double x2q0 = sqrt(x4q0_2);
                q0 = 0.5 * x2q0;
                q1 = 0.5 * x4q0q1 / x2q0;
                q2 = 0.5 * x4q0q2 / x2q0;
                q3 = 0.5 * x4q0q3 / x2q0;
            }
            else if (x4q1_2 >= x4q0_2 && x4q1_2 >= x4q2_2 && x4q1_2 >= x4q3_2) // 4q1_2 Largest
            {
                const double x2q1 = sqrt(x4q1_2);
                q0 = 0.5 * x4q0q1 / x2q1;
                q1 = 0.5 * x2q1;
                q2 = 0.5 * x4q1q2 / x2q1;
                q3 = 0.5 * x4q1q3 / x2q1;
            }
            else if (x4q2_2 >= x4q0_2 && x4q2_2 >= x4q1_2 && x4q2_2 >= x4q3_2) // 4q2_2 Largest
            {
                const double x2q2 = sqrt(x4q2_2);
                q0 = 0.5 * x4q0q2 / x2q2;
                q1 = 0.5 * x4q1q2 / x2q2;
                q2 = 0.5 * x2q2;
                q3 = 0.5 * x4q2q3 / x2q2;
            }
            else if (x4q3_2 >= x4q0_2 && x4q3_2 >= x4q1_2 && x4q3_2 >= x4q2_2) // 4q3_2 Largest
            {
                const double x2q3 = sqrt(x4q3_2);
                q0 = 0.5 * x4q0q3 / x2q3;
                q1 = 0.5 * x4q1q3 / x2q3;
                q2 = 0.5 * x4q2q3 / x2q3;
                q3 = 0.5 * x2q3;
            }
            return Quaternion(q0, q1, q2, q3);
        }
        return Quaternion::identity();
    }